

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O1

int __thiscall
adios2::format::DataManSerializer::GetData<std::__cxx11::string>
          (DataManSerializer *this,string *outputData,string *varName,Dims *varStart,Dims *varCount,
          size_t step,MemorySpace varMemSpace,Dims *varMemStart,Dims *varMemCount)

{
  mutex *__mutex;
  ulong uVar1;
  _Hash_node_base *p_Var2;
  _Hash_node_base *__n;
  int iVar3;
  undefined8 uVar4;
  ulong uVar5;
  _Hash_node_base *p_Var6;
  long lVar7;
  __node_base_ptr p_Var8;
  __node_base_ptr p_Var9;
  DataManVar *j;
  ScopedTimer local_70;
  _Hash_node_base *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  string *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_58 = outputData;
  if ((GetData<std::__cxx11::string>(std::__cxx11::string*,std::__cxx11::string_const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long,adios2::MemorySpace,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
       ::__var677 == '\0') &&
     (iVar3 = __cxa_guard_acquire(&GetData<std::__cxx11::string>(std::__cxx11::string*,std::__cxx11::string_const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long,adios2::MemorySpace,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                                   ::__var677), iVar3 != 0)) {
    uVar4 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                ,
                                "int adios2::format::DataManSerializer::GetData(std::string *, const std::string &, const Dims &, const Dims &, const size_t, const MemorySpace, const Dims &, const Dims &)"
                                ,0x2a5);
    GetData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    __var677 = (void *)ps_timer_create_(uVar4);
    __cxa_guard_release(&GetData<std::__cxx11::string>(std::__cxx11::string*,std::__cxx11::string_const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,unsigned_long,adios2::MemorySpace,std::vector<unsigned_long,std::allocator<unsigned_long>>const&,std::vector<unsigned_long,std::allocator<unsigned_long>>const&)
                         ::__var677);
  }
  local_70.m_timer =
       GetData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
       __var677;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  local_68 = (_Hash_node_base *)0x0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __mutex = &this->m_DataManVarMapMutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  uVar1 = (this->m_DataManVarMap)._M_h._M_bucket_count;
  uVar5 = step % uVar1;
  p_Var8 = (this->m_DataManVarMap)._M_h._M_buckets[uVar5];
  p_Var9 = (__node_base_ptr)0x0;
  if ((p_Var8 != (__node_base_ptr)0x0) &&
     (p_Var6 = p_Var8->_M_nxt, p_Var9 = p_Var8, p_Var8->_M_nxt[1]._M_nxt != (_Hash_node_base *)step)
     ) {
    while (p_Var8 = p_Var6, p_Var6 = p_Var8->_M_nxt, p_Var6 != (_Hash_node_base *)0x0) {
      p_Var9 = (__node_base_ptr)0x0;
      if (((ulong)p_Var6[1]._M_nxt % uVar1 != uVar5) ||
         (p_Var9 = p_Var8, p_Var6[1]._M_nxt == (_Hash_node_base *)step)) goto LAB_00685cd5;
    }
    p_Var9 = (__node_base_ptr)0x0;
  }
LAB_00685cd5:
  if (p_Var9 == (__node_base_ptr)0x0) {
    p_Var6 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var6 = p_Var9->_M_nxt;
  }
  if (p_Var6 == (_Hash_node_base *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    iVar3 = -1;
  }
  else {
    local_68 = p_Var6[2]._M_nxt;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_60,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var6 + 3));
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (local_68 == (_Hash_node_base *)0x0) {
      iVar3 = -2;
    }
    else {
      p_Var6 = local_68->_M_nxt;
      p_Var2 = local_68[1]._M_nxt;
      iVar3 = 0;
      if (p_Var6 != p_Var2) {
        do {
          __n = p_Var6[0xb]._M_nxt;
          if ((__n == (_Hash_node_base *)varName->_M_string_length) &&
             (((__n == (_Hash_node_base *)0x0 ||
               (iVar3 = bcmp(p_Var6[10]._M_nxt,(varName->_M_dataplus)._M_p,(size_t)__n), iVar3 == 0)
               ) && (p_Var6[0x2e]._M_nxt != (_Hash_node_base *)0x0)))) {
            lVar7 = (long)&(p_Var6[0x1e]._M_nxt)->_M_nxt +
                    (long)&(p_Var6[0x2e]._M_nxt)->_M_nxt->_M_nxt;
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,lVar7,(long)&(p_Var6[0x1d]._M_nxt)->_M_nxt + lVar7);
            std::__cxx11::string::operator=((string *)local_58,(string *)local_50);
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
          }
          p_Var6 = p_Var6 + 0x30;
          iVar3 = 0;
        } while (p_Var6 != p_Var2);
      }
    }
  }
  if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_70);
  return iVar3;
}

Assistant:

int DataManSerializer::GetData(std::string *outputData, const std::string &varName,
                               const Dims &varStart, const Dims &varCount, const size_t step,
                               const MemorySpace varMemSpace, const Dims &varMemStart,
                               const Dims &varMemCount)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();

    DmvVecPtr vec = nullptr;

    {
        std::lock_guard<std::mutex> l(m_DataManVarMapMutex);
        const auto &i = m_DataManVarMap.find(step);
        if (i == m_DataManVarMap.end())
        {
            return -1; // step not found
        }
        else
        {
            vec = i->second;
        }
    }

    if (vec == nullptr)
    {
        return -2; // step found but variable not found
    }

    char *input_data = nullptr;

    for (const auto &j : *vec)
    {
        if (j.name == varName)
        {
            if (j.buffer == nullptr)
            {
                continue;
            }
            else
            {
                input_data = reinterpret_cast<char *>(j.buffer->data());
            }

            input_data += j.position;

            *outputData = std::string(input_data, j.size);
        }
    }
    return 0;
}